

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

bool __thiscall Min2<1>::propagate(Min2<1> *this)

{
  bool bVar1;
  Reason *this_00;
  int64_t iVar2;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  int64_t iVar3;
  IntView<1> *this_01;
  IntView<1> *pIVar4;
  Tchar *in_RDI;
  Reason m_r_4;
  int64_t m_v_4;
  Reason m_r_3;
  int64_t m_v_3;
  Reason m_r_2;
  int64_t m_v_2;
  int64_t m;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  IntView<1> *in_stack_ffffffffffffff20;
  IntView<1> *in_stack_ffffffffffffff28;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff30;
  char o;
  Reason local_a8;
  int64_t local_a0;
  anon_union_8_2_743a5d44_for_Reason_0 local_98;
  int local_8c;
  anon_union_8_2_743a5d44_for_Reason_0 local_88;
  int64_t local_80;
  anon_union_8_2_743a5d44_for_Reason_0 local_78;
  int local_70;
  int local_6c;
  anon_union_8_2_743a5d44_for_Reason_0 local_68;
  anon_union_8_2_743a5d44_for_Reason_0 local_60;
  anon_union_8_2_743a5d44_for_Reason_0 local_58;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  int local_44;
  anon_union_8_2_743a5d44_for_Reason_0 local_40;
  int64_t local_38;
  anon_union_8_2_743a5d44_for_Reason_0 local_30;
  int local_24;
  anon_union_8_2_743a5d44_for_Reason_0 local_20;
  int64_t local_18;
  
  local_18 = IntView<1>::getMax(in_stack_ffffffffffffff20);
  bVar1 = IntView<1>::setMaxNotR
                    (in_stack_ffffffffffffff20,
                     CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  if (bVar1) {
    Reason::Reason((Reason *)&local_20,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      local_24 = (int)IntView<1>::getMaxLit
                                ((IntView<1> *)
                                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      Reason::Reason((Reason *)in_stack_ffffffffffffff28,
                     (Lit)(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    }
    local_30 = local_20;
    bVar1 = IntView<1>::setMax(in_stack_ffffffffffffff28,(int64_t)in_stack_ffffffffffffff20,
                               (Reason)in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff1f);
    if (!bVar1) {
      return false;
    }
  }
  local_38 = IntView<1>::getMax(in_stack_ffffffffffffff20);
  bVar1 = IntView<1>::setMaxNotR
                    (in_stack_ffffffffffffff20,
                     CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  if (bVar1) {
    Reason::Reason((Reason *)&local_40,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      local_44 = (int)IntView<1>::getMaxLit
                                ((IntView<1> *)
                                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      Reason::Reason((Reason *)in_stack_ffffffffffffff28,
                     (Lit)(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    }
    local_50 = local_40;
    bVar1 = IntView<1>::setMax(in_stack_ffffffffffffff28,(int64_t)in_stack_ffffffffffffff20,
                               (Reason)in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff1f);
    if (!bVar1) {
      return false;
    }
  }
  this_00 = (Reason *)IntView<1>::getMin(in_stack_ffffffffffffff20);
  iVar2 = IntView<1>::getMin(in_stack_ffffffffffffff20);
  if ((long)this_00 < iVar2) {
    r._a = IntView<1>::getMin(in_stack_ffffffffffffff20);
  }
  else {
    r._a = IntView<1>::getMin(in_stack_ffffffffffffff20);
  }
  local_60 = r;
  local_58 = r;
  bVar1 = IntView<1>::setMinNotR
                    (in_stack_ffffffffffffff20,
                     CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  if (bVar1) {
    Reason::Reason((Reason *)&local_68,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      local_6c = (int)IntView<1>::getFMinLit
                                ((IntView<1> *)
                                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                                 0x27405c);
      local_70 = (int)IntView<1>::getFMinLit
                                ((IntView<1> *)
                                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                                 0x274076);
      Reason::Reason(this_00,(Lit)(int)((ulong)in_RDI >> 0x20),(Lit)(int)in_RDI);
    }
    local_78 = local_68;
    bVar1 = IntView<1>::setMin(in_stack_ffffffffffffff28,(int64_t)in_stack_ffffffffffffff20,
                               (Reason)r,(bool)in_stack_ffffffffffffff1f);
    if (!bVar1) {
      return false;
    }
  }
  o = (char)((ulong)this_00 >> 0x38);
  local_80 = IntView<1>::getMin(in_stack_ffffffffffffff20);
  bVar1 = IntView<1>::setMinNotR
                    (in_stack_ffffffffffffff20,
                     CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  if (bVar1) {
    Reason::Reason((Reason *)&local_88,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      local_8c = (int)IntView<1>::getMinLit
                                ((IntView<1> *)
                                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      Reason::Reason((Reason *)in_stack_ffffffffffffff28,(Lit)(int)((ulong)r >> 0x20));
    }
    local_98 = local_88;
    bVar1 = IntView<1>::setMin(in_stack_ffffffffffffff28,(int64_t)in_stack_ffffffffffffff20,
                               (Reason)r,(bool)in_stack_ffffffffffffff1f);
    if (!bVar1) {
      return false;
    }
  }
  local_a0 = IntView<1>::getMin(in_stack_ffffffffffffff20);
  bVar1 = IntView<1>::setMinNotR
                    (in_stack_ffffffffffffff20,
                     CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  if (bVar1) {
    Reason::Reason(&local_a8,(Clause *)0x0);
    if ((so.lazy & 1U) != 0) {
      IntView<1>::getMinLit
                ((IntView<1> *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      Reason::Reason((Reason *)in_stack_ffffffffffffff28,(Lit)(int)((ulong)r >> 0x20));
    }
    bVar1 = IntView<1>::setMin(in_stack_ffffffffffffff28,(int64_t)in_stack_ffffffffffffff20,
                               (Reason)r,(bool)in_stack_ffffffffffffff1f);
    if (!bVar1) {
      return false;
    }
  }
  iVar2 = IntView<1>::getMin(in_stack_ffffffffffffff20);
  iVar3 = IntView<1>::getMax(in_stack_ffffffffffffff20);
  if (iVar2 != iVar3) {
    this_01 = (IntView<1> *)IntView<1>::getMin(in_stack_ffffffffffffff20);
    pIVar4 = (IntView<1> *)IntView<1>::getMax(this_01);
    if (this_01 != pIVar4) {
      return true;
    }
  }
  Tchar::operator=(in_RDI,o);
  return true;
}

Assistant:

bool propagate() override {
		// make a less than or equal to min(max(b_i))

		setDom(z, setMax, x.getMax(), x.getMaxLit());
		setDom(z, setMax, y.getMax(), y.getMaxLit());

		const int64_t m = (x.getMin() < y.getMin() ? x.getMin() : y.getMin());
		setDom(z, setMin, m, x.getFMinLit(m), y.getFMinLit(m));

		setDom(x, setMin, z.getMin(), z.getMinLit());
		setDom(y, setMin, z.getMin(), z.getMinLit());

		if (z.getMin() == x.getMax() || z.getMin() == y.getMax()) {
			satisfied = true;
		}

		return true;
	}